

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

complex<double> * __thiscall
TPZSkylMatrix<std::complex<double>_>::operator()
          (TPZSkylMatrix<std::complex<double>_> *this,int64_t r,int64_t c)

{
  complex<double> **ppcVar1;
  long lVar2;
  
  lVar2 = r - c;
  if (lVar2 == 0 || r < c) {
    lVar2 = -(r - c);
    r = c;
  }
  ppcVar1 = (this->fElem).fStore;
  if ((long)ppcVar1[r + 1] - (long)ppcVar1[r] >> 4 <= lVar2) {
    TPZMatrix<std::complex<double>_>::Error
              ("TVar &TPZSkylMatrix<std::complex<double>>::operator()(const int64_t, const int64_t) [TVar = std::complex<double>]"
               ,"Index out of range");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzskylmat.cpp"
               ,0xc5);
  }
  return (this->fElem).fStore[r] + lVar2;
}

Assistant:

TVar &
TPZSkylMatrix<TVar>::operator()(const int64_t r, const int64_t c) {
	int64_t row(r),col(c);
	if ( row > col ) this->Swap( &row, &col );
	
	// Indice do vetor coluna.
	int64_t index = col - row;
	if ( index >= Size(col) ) {
		//Error("TPZSkylMatrix::operator()","Index out of range");
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"Index out of range");
		DebugStop();
	}
	return fElem[col][index];
}